

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_remove(adt_ary_t *self,void *pElem)

{
  adt_error_t aVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)self->s32CurLen;
  if (self->s32CurLen < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return '\0';
    }
    if (self->pFirst[uVar2] == pElem) break;
    uVar2 = uVar2 + 1;
  }
  aVar1 = adt_ary_splice(self,(int32_t)uVar2,1);
  return aVar1;
}

Assistant:

adt_error_t adt_ary_remove(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      adt_error_t result = ADT_NO_ERROR;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem){
            result = adt_ary_splice(self, s32Index, 1);
            break;
         }
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}